

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  char *pcVar2;
  size_t __len;
  tbinptr pmVar3;
  tbinptr pmVar4;
  malloc_tree_chunk *pmVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  malloc_tree_chunk *pmVar10;
  ulong uVar11;
  long lVar12;
  malloc_tree_chunk *pmVar13;
  tbinptr pmVar14;
  
  pmVar1 = (tbinptr)((long)&p->prev_foot + psize);
  if ((p->head & 1) == 0) {
    uVar11 = p->prev_foot;
    if ((p->head & 2) == 0) {
      __len = psize + 0x20 + uVar11;
      iVar8 = munmap((void *)((long)p - uVar11),__len);
      if (iVar8 != 0) {
        return;
      }
      m->footprint = m->footprint - __len;
      return;
    }
    pmVar3 = (tbinptr)m->least_addr;
    p = (mchunkptr)((long)p - uVar11);
    if (p < pmVar3) goto LAB_00136b94;
    psize = psize + uVar11;
    if ((tbinptr)p == (tbinptr)m->dv) {
      uVar11 = pmVar1->head;
      if ((~(uint)uVar11 & 3) == 0) {
        m->dvsize = psize;
        pmVar1->head = uVar11 & 0xfffffffffffffffe;
        ((tbinptr)p)->head = psize | 1;
        pmVar1->prev_foot = psize;
        return;
      }
    }
    else if (uVar11 < 0x100) {
      pmVar4 = ((tbinptr)p)->fd;
      pmVar14 = ((tbinptr)p)->bk;
      if ((pmVar4 != (tbinptr)(m->smallbins + (uVar11 >> 3) * 2)) &&
         ((pmVar4 < pmVar3 || (pmVar4->bk != (malloc_tree_chunk *)p)))) goto LAB_00136b94;
      if (pmVar14 == pmVar4) {
        bVar6 = (byte)(uVar11 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      else {
        if ((pmVar14 != (tbinptr)(m->smallbins + (uVar11 >> 3) * 2)) &&
           ((pmVar14 < pmVar3 || (pmVar14->fd != (malloc_tree_chunk *)p)))) goto LAB_00136b94;
        pmVar4->bk = pmVar14;
        pmVar14->fd = pmVar4;
      }
    }
    else {
      pmVar13 = ((tbinptr)p)->bk;
      pmVar10 = ((tbinptr)p)->child[2];
      if (pmVar13 == (malloc_tree_chunk *)p) {
        if (((tbinptr)p)->child[1] == (malloc_tree_chunk *)0x0) {
          if (((tbinptr)p)->child[0] == (malloc_tree_chunk *)0x0) {
            pmVar13 = (malloc_tree_chunk *)0x0;
            goto LAB_0013674a;
          }
          pmVar5 = ((tbinptr)p)->child[0];
          pmVar4 = (tbinptr)((tbinptr)p)->child;
        }
        else {
          pmVar5 = ((tbinptr)p)->child[1];
          pmVar4 = (tbinptr)(((tbinptr)p)->child + 1);
        }
        do {
          do {
            pmVar14 = pmVar4;
            pmVar13 = pmVar5;
            pmVar5 = pmVar13->child[1];
            pmVar4 = (tbinptr)(pmVar13->child + 1);
          } while (pmVar13->child[1] != (malloc_tree_chunk *)0x0);
          pmVar5 = pmVar13->child[0];
          pmVar4 = (tbinptr)pmVar13->child;
        } while (pmVar13->child[0] != (malloc_tree_chunk *)0x0);
        if (pmVar14 < pmVar3) goto LAB_00136b94;
        pmVar14->prev_foot = 0;
      }
      else {
        pmVar4 = ((tbinptr)p)->fd;
        if (((pmVar4 < pmVar3) || (pmVar4->bk != (malloc_tree_chunk *)p)) ||
           (pmVar13->fd != (malloc_tree_chunk *)p)) goto LAB_00136b94;
        pmVar4->bk = pmVar13;
        pmVar13->fd = pmVar4;
      }
LAB_0013674a:
      if (pmVar10 != (malloc_tree_chunk *)0x0) {
        uVar9 = *(uint *)(((tbinptr)p)->child + 3);
        if ((tbinptr)p == m->treebins[uVar9]) {
          m->treebins[uVar9] = pmVar13;
          if (pmVar13 == (malloc_tree_chunk *)0x0) {
            bVar6 = (byte)uVar9 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          }
          else {
LAB_0013678c:
            pmVar5 = (malloc_tree_chunk *)m->least_addr;
            if (pmVar13 < pmVar5) goto LAB_00136b94;
            pmVar13->child[2] = pmVar10;
            pmVar10 = ((tbinptr)p)->child[0];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < pmVar5) goto LAB_00136b94;
              pmVar13->child[0] = pmVar10;
              pmVar10->child[2] = pmVar13;
            }
            pmVar10 = ((tbinptr)p)->child[1];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < (malloc_tree_chunk *)m->least_addr) goto LAB_00136b94;
              pmVar13->child[1] = pmVar10;
              pmVar10->parent = pmVar13;
            }
          }
        }
        else {
          if (pmVar10 < (malloc_tree_chunk *)m->least_addr) goto LAB_00136b94;
          pmVar10->child[pmVar10->child[0] != (malloc_tree_chunk *)p] = pmVar13;
          if (pmVar13 != (malloc_tree_chunk *)0x0) goto LAB_0013678c;
        }
      }
    }
  }
  pmVar3 = (tbinptr)m->least_addr;
  if (pmVar1 < pmVar3) goto LAB_00136b94;
  uVar11 = pmVar1->head;
  if ((uVar11 & 2) == 0) {
    if (pmVar1 == (tbinptr)m->top) {
      uVar11 = psize + m->topsize;
      m->topsize = uVar11;
      m->top = p;
      ((tbinptr)p)->head = uVar11 | 1;
      if ((tbinptr)p != (tbinptr)m->dv) {
        return;
      }
      m->dv = (mchunkptr)0x0;
      m->dvsize = 0;
      return;
    }
    if (pmVar1 == (tbinptr)m->dv) {
      uVar11 = psize + m->dvsize;
      m->dvsize = uVar11;
      m->dv = p;
      ((tbinptr)p)->head = uVar11 | 1;
      *(ulong *)((long)((tbinptr)p)->child + (uVar11 - 0x20)) = uVar11;
      return;
    }
    if (uVar11 < 0x100) {
      pmVar4 = pmVar1->fd;
      pmVar14 = pmVar1->bk;
      if ((pmVar4 != (tbinptr)(m->smallbins + (uVar11 >> 3) * 2)) &&
         ((pmVar4 < pmVar3 || (pmVar4->bk != pmVar1)))) goto LAB_00136b94;
      if (pmVar14 == pmVar4) {
        bVar6 = (byte)(uVar11 >> 3) & 0x1f;
        m->smallmap = m->smallmap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      }
      else {
        if ((pmVar14 != (tbinptr)(m->smallbins + (uVar11 >> 3) * 2)) &&
           ((pmVar14 < pmVar3 || (pmVar14->fd != pmVar1)))) goto LAB_00136b94;
        pmVar4->bk = pmVar14;
        pmVar14->fd = pmVar4;
      }
    }
    else {
      pmVar13 = pmVar1->bk;
      pmVar10 = pmVar1->child[2];
      if (pmVar13 == pmVar1) {
        if (pmVar1->child[1] == (malloc_tree_chunk *)0x0) {
          if (pmVar1->child[0] == (malloc_tree_chunk *)0x0) {
            pmVar13 = (malloc_tree_chunk *)0x0;
            goto LAB_00136adb;
          }
          pmVar5 = pmVar1->child[0];
          pmVar4 = (tbinptr)pmVar1->child;
        }
        else {
          pmVar5 = pmVar1->child[1];
          pmVar4 = (tbinptr)(pmVar1->child + 1);
        }
        do {
          do {
            pmVar14 = pmVar4;
            pmVar13 = pmVar5;
            pmVar5 = pmVar13->child[1];
            pmVar4 = (tbinptr)(pmVar13->child + 1);
          } while (pmVar13->child[1] != (malloc_tree_chunk *)0x0);
          pmVar5 = pmVar13->child[0];
          pmVar4 = (tbinptr)pmVar13->child;
        } while (pmVar13->child[0] != (malloc_tree_chunk *)0x0);
        if (pmVar14 < pmVar3) goto LAB_00136b94;
        pmVar14->prev_foot = 0;
      }
      else {
        pmVar4 = pmVar1->fd;
        if (((pmVar4 < pmVar3) || (pmVar4->bk != pmVar1)) || (pmVar13->fd != pmVar1))
        goto LAB_00136b94;
        pmVar4->bk = pmVar13;
        pmVar13->fd = pmVar4;
      }
LAB_00136adb:
      if (pmVar10 != (malloc_tree_chunk *)0x0) {
        uVar9 = *(uint *)(pmVar1->child + 3);
        if (pmVar1 == m->treebins[uVar9]) {
          m->treebins[uVar9] = pmVar13;
          if (pmVar13 == (malloc_tree_chunk *)0x0) {
            bVar6 = (byte)uVar9 & 0x1f;
            m->treemap = m->treemap & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
          }
          else {
LAB_00136b19:
            pmVar5 = (malloc_tree_chunk *)m->least_addr;
            if (pmVar13 < pmVar5) goto LAB_00136b94;
            pmVar13->child[2] = pmVar10;
            pmVar10 = pmVar1->child[0];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < pmVar5) goto LAB_00136b94;
              pmVar13->child[0] = pmVar10;
              pmVar10->child[2] = pmVar13;
            }
            pmVar10 = pmVar1->child[1];
            if (pmVar10 != (malloc_tree_chunk *)0x0) {
              if (pmVar10 < (malloc_tree_chunk *)m->least_addr) goto LAB_00136b94;
              pmVar13->child[1] = pmVar10;
              pmVar10->parent = pmVar13;
            }
          }
        }
        else {
          if (pmVar10 < (malloc_tree_chunk *)m->least_addr) goto LAB_00136b94;
          pmVar10->child[pmVar10->child[0] != pmVar1] = pmVar13;
          if (pmVar13 != (malloc_tree_chunk *)0x0) goto LAB_00136b19;
        }
      }
    }
    psize = psize + (uVar11 & 0xfffffffffffffff8);
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
    if ((tbinptr)p == (tbinptr)m->dv) {
      m->dvsize = psize;
      return;
    }
  }
  else {
    pmVar1->head = uVar11 & 0xfffffffffffffffe;
    ((tbinptr)p)->head = psize | 1;
    *(size_t *)((long)((tbinptr)p)->child + (psize - 0x20)) = psize;
  }
  if (psize < 0x100) {
    pmVar13 = (malloc_tree_chunk *)(m->smallbins + (psize >> 3) * 2);
    uVar9 = (uint)(psize >> 3);
    if ((m->smallmap >> (uVar9 & 0x1f) & 1) == 0) {
      m->smallmap = m->smallmap | 1 << (uVar9 & 0x1f);
      pmVar10 = pmVar13;
    }
    else {
      pmVar10 = pmVar13->fd;
      if (pmVar13->fd < (malloc_tree_chunk *)m->least_addr) {
LAB_00136b94:
        abort();
      }
    }
    pmVar13->fd = (malloc_tree_chunk *)p;
    pmVar10->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = pmVar10;
    ((tbinptr)p)->bk = pmVar13;
  }
  else {
    uVar9 = (uint)(psize >> 8);
    if (uVar9 == 0) {
      uVar9 = 0;
    }
    else if (uVar9 < 0x10000) {
      uVar9 = ((uint)(psize >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar9)) & 0x3f)) & 1) +
              LZCOUNT(uVar9) * 2 ^ 0x3e;
    }
    else {
      uVar9 = 0x1f;
    }
    *(uint *)(((tbinptr)p)->child + 3) = uVar9;
    pmVar13 = (malloc_tree_chunk *)(m->treebins + uVar9);
    ((tbinptr)p)->child[0] = (malloc_tree_chunk *)0x0;
    ((tbinptr)p)->child[1] = (malloc_tree_chunk *)0x0;
    if ((m->treemap >> (uVar9 & 0x1f) & 1) == 0) {
      m->treemap = m->treemap | 1 << (uVar9 & 0x1f);
      pmVar13->prev_foot = (size_t)p;
      ((tbinptr)p)->child[2] = pmVar13;
    }
    else {
      uVar11 = (ulong)(byte)(0x39 - (char)(uVar9 >> 1));
      if (uVar9 == 0x1f) {
        uVar11 = 0;
      }
      lVar12 = psize << (uVar11 & 0x3f);
      pmVar13 = (malloc_tree_chunk *)pmVar13->prev_foot;
      do {
        pmVar10 = pmVar13;
        if ((pmVar10->head & 0xfffffffffffffff8) == psize) {
          if (((malloc_tree_chunk *)m->least_addr <= pmVar10) &&
             (pmVar13 = pmVar10->fd, (malloc_tree_chunk *)m->least_addr <= pmVar13)) {
            pmVar13->bk = (malloc_tree_chunk *)p;
            pmVar10->fd = (malloc_tree_chunk *)p;
            ((tbinptr)p)->fd = pmVar13;
            ((tbinptr)p)->bk = pmVar10;
            ((tbinptr)p)->child[2] = (malloc_tree_chunk *)0x0;
            return;
          }
          goto LAB_00136b94;
        }
        lVar7 = lVar12 >> 0x3f;
        lVar12 = lVar12 * 2;
        pmVar13 = *(malloc_tree_chunk **)((long)pmVar10 + lVar7 * -8 + 0x20);
      } while (pmVar13 != (malloc_tree_chunk *)0x0);
      pcVar2 = (char *)((long)pmVar10 + lVar7 * -8 + 0x20);
      if (pcVar2 < m->least_addr) goto LAB_00136b94;
      *(mchunkptr *)pcVar2 = p;
      ((tbinptr)p)->child[2] = pmVar10;
    }
    ((tbinptr)p)->bk = (malloc_tree_chunk *)p;
    ((tbinptr)p)->fd = (malloc_tree_chunk *)p;
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}